

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O3

void __thiscall
nonstd::optional_lite::detail::storage_t<tinyusdz::value::AssetPath>::construct_value
          (storage_t<tinyusdz::value::AssetPath> *this,value_type *v)

{
  pointer pcVar1;
  
  *(storage_t<tinyusdz::value::AssetPath> **)this = this + 0x10;
  pcVar1 = (v->asset_path_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (v->asset_path_)._M_string_length);
  *(storage_t<tinyusdz::value::AssetPath> **)(this + 0x20) = this + 0x30;
  pcVar1 = (v->resolved_path_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(this + 0x20),pcVar1,pcVar1 + (v->resolved_path_)._M_string_length);
  return;
}

Assistant:

void construct_value( value_type const & v )
    {
        ::new( value_ptr() ) value_type( v );
    }